

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_properties.c
# Opt level: O0

int mpt_message_property(mpt_message *msg,int sep,mpt_property_handler_t sfcn,void *spar)

{
  void *pvVar1;
  iovec *piVar2;
  size_t sVar3;
  size_t len_00;
  undefined1 *puVar4;
  long lVar5;
  ssize_t len;
  ssize_t part;
  char *pos;
  char buf [1024];
  undefined1 local_80 [8];
  mpt_property prop;
  mpt_message tmp;
  void *spar_local;
  mpt_property_handler_t sfcn_local;
  int sep_local;
  mpt_message *msg_local;
  
  memset(local_80,0,0x30);
  prop._buf._8_8_ = msg->used;
  pvVar1 = msg->base;
  piVar2 = msg->cont;
  sVar3 = msg->clen;
  len_00 = mpt_message_argv((mpt_message *)(prop._buf + 8),sep);
  if ((long)len_00 < 1) {
    msg_local._4_4_ = -0x10;
  }
  else if ((long)len_00 < 0x400) {
    mpt_message_read((mpt_message *)(prop._buf + 8),len_00,&pos);
    buf[len_00 - 8] = '\0';
    puVar4 = (undefined1 *)memchr(&pos,0x3d,len_00);
    if (puVar4 == (undefined1 *)0x0) {
      msg_local._4_4_ = -8;
    }
    else {
      *puVar4 = 0;
      local_80 = (undefined1  [8])&pos;
      prop.val._type = (mpt_type_t)(puVar4 + 1);
      lVar5 = len_00 - (prop.val._type - (long)&pos);
      if (((char)pos == '\'') || ((char)pos == '\"')) {
        if ((char)pos == *(char *)(prop.val._type + lVar5 + -1)) {
          *(char *)(prop.val._type + lVar5 + -1) = '\0';
          local_80 = (undefined1  [8])((long)&pos + 1);
        }
      }
      else if (((*(char *)prop.val._type == '\'') || (*(char *)prop.val._type == '\"')) &&
              (*(char *)prop.val._type == *(char *)(prop.val._type + lVar5 + -1))) {
        *(char *)(prop.val._type + lVar5 + -1) = '\0';
        prop.val._type = (mpt_type_t)(puVar4 + 2);
      }
      prop.desc = (char *)&prop.val._type;
      prop.val._addr = (void *)0x73;
      msg_local._4_4_ = (*sfcn)(spar,(mpt_property *)local_80);
      if (msg_local._4_4_ < 0) {
        msg_local._4_4_ = -2;
      }
      else {
        msg->used = prop._buf._8_8_;
        msg->base = pvVar1;
        msg->cont = piVar2;
        msg->clen = sVar3;
      }
    }
  }
  else {
    msg_local._4_4_ = -0x11;
  }
  return msg_local._4_4_;
}

Assistant:

extern int mpt_message_property(MPT_STRUCT(message) *msg, int sep, MPT_TYPE(property_handler) sfcn, void *spar)
{
	MPT_STRUCT(message) tmp;
	MPT_STRUCT(property) prop = MPT_PROPERTY_INIT;
	char buf[1024], *pos;
	ssize_t part, len;
	
	tmp = *msg;
	if ((part = mpt_message_argv(&tmp, sep)) <= 0) {
		return MPT_ERROR(MissingData);
	}
	if (part >= (ssize_t) sizeof(buf)) {
		return MPT_ERROR(MissingBuffer);
	}
	mpt_message_read(&tmp, part, buf);
	buf[part] = '\0';
	
	if (!(pos = memchr(buf, '=', part))) {
		return MPT_ERROR(BadEncoding);
	}
	*pos = 0;
	
	prop.name = buf;
	MPT_property_set_string(&prop, ++pos);
	
	len = part - (pos - buf);
	
	if (*buf == '\'' || *buf == '"') {
		if (*buf == pos[len - 1]) {
			pos[len - 1] = '\0';
			++prop.name;
		}
	}
	else if (*pos == '\'' || *pos == '"') {
		if (*pos == pos[len - 1]) {
			pos[len - 1] = '\0';
			MPT_property_set_string(&prop, ++pos);
		}
	}
	if ((part = sfcn(spar, &prop)) < 0) {
		return MPT_ERROR(BadValue);
	}
	*msg = tmp;
	return part;
}